

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,QPodPoint *p,QPodPoint *v1,QPodPoint *v2,QPodPoint *v3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = v2->x;
  lVar6 = (long)v1->x - (long)iVar1;
  iVar2 = v2->y;
  lVar8 = (long)v1->y - (long)iVar2;
  lVar7 = (p->y - iVar2) * lVar6;
  lVar9 = (p->x - iVar1) * lVar8;
  iVar3 = v3->x;
  iVar4 = v3->y;
  lVar10 = (long)(p->y - iVar4) * (long)(iVar1 - iVar3);
  lVar11 = (long)(p->x - iVar3) * (long)(iVar2 - iVar4);
  if ((iVar3 - iVar1) * lVar8 < (iVar4 - iVar2) * lVar6) {
    bVar5 = lVar9 <= lVar7 && lVar11 <= lVar10;
  }
  else {
    bVar5 = lVar9 <= lVar7 || lVar11 <= lVar10;
  }
  return bVar5;
}

Assistant:

inline QPodPoint operator - (const QPodPoint &other) const {QPodPoint result = {x - other.x, y - other.y}; return result;}